

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O0

void print_usage(char **argv)

{
  long lVar1;
  long in_FS_OFFSET;
  char **argv_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  printf("Usage:\n");
  printf(" %s [-hpkels] [-o file] [-t template] <socket>...\n",*argv);
  printf("\nSocket:\n");
  printf(" tcp [-hpkb bindaddr] <host> <port>\n");
  printf("\nOptions:\n");
  printf("-b  bindaddr Hostnamne or IP address to connect from\n\n");
  printf("-k  Print information about SPKI updates.\n");
  printf("-p  Print information about PFX updates.\n");
  printf("-a  Print information about ASPA updates.\n");
  printf("-s  Print information about connection status updates.\n\n");
  printf("-e  export pfx table and exit\n");
  printf("-o  output file for export\n");
  printf("-t  template used for export\n");
  printf("-l  list available templates\n\n");
  printf("-h  Print this help message.\n");
  printf("\nExamples:\n");
  printf(" %s tcp rpki-validator.realmv6.org 8283\n",*argv);
  printf(" %s tcp -k -p rpki-validator.realmv6.org 8283\n",*argv);
  printf(" %s tcp -k rpki-validator.realmv6.org 8283 tcp -s example.com 323\n",*argv);
  printf(" %s -kp tcp rpki-validator.realmv6.org 8283 tcp example.com 323\n",*argv);
  printf(" %s -e tcp rpki-validator.realmv6.org 8283\n",*argv);
  printf(" %s -e -t csv -o roa.csv tcp rpki-validator.realmv6.org 8283\n",*argv);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void print_usage(char **argv)
{
	printf("Usage:\n");
	printf(" %s [-hpkels] [-o file] [-t template] <socket>...\n", argv[0]);
	printf("\nSocket:\n");
	printf(" tcp [-hpkb bindaddr] <host> <port>\n");
#ifdef RTRLIB_HAVE_LIBSSH
	printf(" ssh [-hpkb bindaddr] <host> <port> <username> (<private_key> | <password>) [<host_key>]\n");
#endif
	printf("\nOptions:\n");
	printf("-b  bindaddr Hostnamne or IP address to connect from\n\n");

#ifdef RTRLIB_HAVE_LIBSSH
	printf("-w  force ssh authentication information to be interpreted as a password\n");
	printf("-r  force ssh authentication information to be interpreted as a private key\n\n");
#endif

	printf("-k  Print information about SPKI updates.\n");
	printf("-p  Print information about PFX updates.\n");
	printf("-a  Print information about ASPA updates.\n");
	printf("-s  Print information about connection status updates.\n\n");

	printf("-e  export pfx table and exit\n");
	printf("-o  output file for export\n");
	printf("-t  template used for export\n");
	printf("-l  list available templates\n\n");

	printf("-h  Print this help message.\n");

	printf("\nExamples:\n");
	printf(" %s tcp rpki-validator.realmv6.org 8283\n", argv[0]);
	printf(" %s tcp -k -p rpki-validator.realmv6.org 8283\n", argv[0]);
	printf(" %s tcp -k rpki-validator.realmv6.org 8283 tcp -s example.com 323\n", argv[0]);
	printf(" %s -kp tcp rpki-validator.realmv6.org 8283 tcp example.com 323\n", argv[0]);
#ifdef RTRLIB_HAVE_LIBSSH
	printf(" %s ssh rpki-validator.realmv6.org 22 rtr-ssh", argv[0]);
	printf(" ~/.ssh/id_rsa ~/.ssh/known_hosts\n");
	printf(" %s ssh -k -p rpki-validator.realmv6.org 22 rtr-ssh ~/.ssh/id_rsa ~/.ssh/known_hosts\n", argv[0]);
	printf(" %s ssh -k -p rpki-validator.realmv6.org 22 rtr-ssh ~/.ssh/id_rsa ~/.ssh/known_hosts", argv[0]);
	printf(" ssh -k -p example.com 22 rtr-ssh ~/.ssh/id_rsa_example\n");
	printf(" %s ssh -k -p rpki-validator.realmv6.org 22 rtr-ssh ~/.ssh/id_rsa ~/.ssh/known_hosts", argv[0]);
	printf(" tcp -k -p example.com 323\n");
#endif

	printf(" %s -e tcp rpki-validator.realmv6.org 8283\n", argv[0]);
	printf(" %s -e -t csv -o roa.csv tcp rpki-validator.realmv6.org 8283\n", argv[0]);
}